

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA.cpp
# Opt level: O1

void SampleRandomPolicy(DecPOMDPDiscreteInterface *dpomdp,Arguments *args)

{
  long *plVar1;
  NullPlanner *this;
  ulong uVar2;
  AgentRandom *this_00;
  ostream *poVar3;
  ulong uVar4;
  undefined8 uVar5;
  uint uVar6;
  vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> agents;
  AgentFullyObservable *agent1;
  SimulationResult result;
  AgentRandom agent;
  SimulationDecPOMDPDiscrete sim;
  void *local_108;
  iterator iStack_100;
  AgentFullyObservable **local_f8;
  AgentRandom *local_f0;
  Arguments *local_e8;
  double local_e0;
  vector<double,_std::allocator<double>_> local_d8;
  undefined8 local_c0;
  undefined4 local_b8;
  double local_b0;
  vector<double,_std::allocator<double>_> local_a8;
  undefined8 local_90;
  undefined4 local_88;
  vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> local_80 [3];
  
  this = (NullPlanner *)operator_new(0x338);
  NullPlanner::NullPlanner
            (this,(long)args->horizon,dpomdp,(PlanningUnitMADPDiscreteParameters *)0x0);
  local_e8 = args;
  SimulationDecPOMDPDiscrete::SimulationDecPOMDPDiscrete
            ((SimulationDecPOMDPDiscrete *)local_80,(PlanningUnitDecPOMDPDiscrete *)this,args);
  local_80[0].super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  SimulationResult::SimulationResult((SimulationResult *)&local_e0);
  local_108 = (void *)0x0;
  iStack_100._M_current = (AgentFullyObservable **)0x0;
  local_f8 = (AgentFullyObservable **)0x0;
  uVar4 = 0;
  while( true ) {
    uVar2 = (**(code **)(*(long *)this + 0x30))(this);
    if (uVar2 == uVar4) break;
    AgentRandom::AgentRandom((AgentRandom *)&local_b0,(PlanningUnitDecPOMDPDiscrete *)this,0);
    this_00 = (AgentRandom *)operator_new(0x28);
    AgentRandom::AgentRandom(this_00,(AgentRandom *)&local_b0);
    local_f0 = this_00;
    (**(code **)(*(long *)(this_00 + *(long *)(*(long *)this_00 + -0x18)) + 0x18))
              (this_00 + *(long *)(*(long *)this_00 + -0x18),uVar4);
    if (iStack_100._M_current == local_f8) {
      std::vector<AgentFullyObservable*,std::allocator<AgentFullyObservable*>>::
      _M_realloc_insert<AgentFullyObservable*const&>
                ((vector<AgentFullyObservable*,std::allocator<AgentFullyObservable*>> *)&local_108,
                 iStack_100,(AgentFullyObservable **)&local_f0);
    }
    else {
      *iStack_100._M_current = (AgentFullyObservable *)local_f0;
      iStack_100._M_current = iStack_100._M_current + 1;
    }
    AgentRandom::~AgentRandom((AgentRandom *)&local_b0);
    uVar4 = (ulong)((int)uVar4 + 1);
  }
  SimulationDecPOMDPDiscrete::RunSimulations<AgentFullyObservable>
            ((SimulationDecPOMDPDiscrete *)&local_b0,local_80);
  local_e0 = local_b0;
  std::vector<double,_std::allocator<double>_>::operator=(&local_d8,&local_a8);
  local_b8 = local_88;
  local_c0 = local_90;
  SimulationResult::~SimulationResult((SimulationResult *)&local_b0);
  if (-1 < local_e8->verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"evaluateRandomPolicy sampled value: ",0x24);
    poVar3 = std::ostream::_M_insert<double>(local_e0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  uVar6 = 0;
  while( true ) {
    uVar4 = (**(code **)(*(long *)this + 0x30))(this);
    uVar2 = (ulong)uVar6;
    if (uVar4 == uVar2) {
      (**(code **)(*(long *)this + 8))(this);
      if (local_108 != (void *)0x0) {
        operator_delete(local_108,(long)local_f8 - (long)local_108);
      }
      SimulationResult::~SimulationResult((SimulationResult *)&local_e0);
      SimulationDecPOMDPDiscrete::~SimulationDecPOMDPDiscrete
                ((SimulationDecPOMDPDiscrete *)local_80);
      return;
    }
    if ((ulong)((long)iStack_100._M_current - (long)local_108 >> 3) <= uVar2) break;
    plVar1 = *(long **)((long)local_108 + uVar2 * 8);
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
    uVar6 = uVar6 + 1;
  }
  uVar5 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar2);
  SimulationResult::~SimulationResult((SimulationResult *)&local_b0);
  if (local_108 != (void *)0x0) {
    operator_delete(local_108,(long)local_f8 - (long)local_108);
  }
  SimulationResult::~SimulationResult((SimulationResult *)&local_e0);
  SimulationDecPOMDPDiscrete::~SimulationDecPOMDPDiscrete((SimulationDecPOMDPDiscrete *)local_80);
  _Unwind_Resume(uVar5);
}

Assistant:

void SampleRandomPolicy(DecPOMDPDiscreteInterface* dpomdp,
                        const ArgumentHandlers::Arguments &args)
{
    NullPlanner* np=new NullPlanner(args.horizon,dpomdp);

    SimulationDecPOMDPDiscrete sim(*np,args);
    sim.SetVerbose(false);
    SimulationResult result;

    vector<AgentFullyObservable*> agents;
    for(unsigned int i=0;i!=np->GetNrAgents();++i)
    {
        AgentFullyObservable *agent1;
        AgentRandom agent(np,0);
        agent1=new AgentRandom(agent);
        agent1->SetIndex(i);
        agents.push_back(agent1);
    }
    result=sim.RunSimulations(agents);

    if(args.verbose >= 0)
        cout << "evaluateRandomPolicy sampled value: "
             << result.GetAvgReward() << endl;

    for(unsigned int i=0;i!=np->GetNrAgents();++i)
        delete agents.at(i);
    delete np;
}